

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  Location *this_00;
  bool bVar1;
  bool bVar2;
  int path1;
  Token *pTVar3;
  uint32_t *puVar4;
  Arena *arena;
  string_view local_178;
  undefined1 local_168 [8];
  LocationRecorder extendee_location;
  FieldDescriptorProto *field;
  LocationRecorder location;
  undefined1 auStack_118 [7];
  bool is_first;
  undefined1 local_108 [8];
  Token extendee_end;
  undefined1 local_c0 [8];
  string extendee;
  Token extendee_start;
  LocationRecorder *extend_location_local;
  int location_field_number_for_nested_type_local;
  LocationRecorder *parent_location_local;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions_local;
  Parser *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&extendee_start.end_column,"extend"
            );
  bVar1 = Consume(this,stack0xffffffffffffff98);
  if (bVar1) {
    pTVar3 = io::Tokenizer::current(this->input_);
    io::Tokenizer::Token::Token((Token *)((long)&extendee.field_2 + 8),pTVar3);
    std::__cxx11::string::string((string *)local_c0);
    bVar1 = ParseUserDefinedType(this,(string *)local_c0);
    if (bVar1) {
      pTVar3 = io::Tokenizer::previous(this->input_);
      io::Tokenizer::Token::Token((Token *)local_108,pTVar3);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_118,"{");
      bVar1 = ConsumeEndOfDeclaration(this,_auStack_118,extend_location);
      if (bVar1) {
        bVar1 = true;
        do {
          bVar2 = AtEnd(this);
          if (bVar2) {
            ErrorMaker::ErrorMaker
                      ((ErrorMaker *)&location.location_,
                       "Reached end of input in extend definition (missing \'}\').");
            RecordError(this,stack0xfffffffffffffed0);
            this_local._7_1_ = false;
            goto LAB_00599ffb;
          }
          path1 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::size(extensions);
          LocationRecorder::LocationRecorder((LocationRecorder *)&field,extend_location,path1);
          extendee_location.location_ =
               (Location *)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(extensions)
          ;
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_168,(LocationRecorder *)&field,2);
          LocationRecorder::StartAt
                    ((LocationRecorder *)local_168,(Token *)((long)&extendee.field_2 + 8));
          LocationRecorder::EndAt((LocationRecorder *)local_168,(Token *)local_108);
          if (bVar1) {
            LocationRecorder::RecordLegacyLocation
                      ((LocationRecorder *)local_168,&(extendee_location.location_)->super_Message,
                       EXTENDEE);
            bVar1 = false;
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_168);
          this_00 = extendee_location.location_;
          puVar4 = protobuf::internal::HasBits<1>::operator[]
                             (&((extendee_location.location_)->field_0)._impl_._has_bits_,0);
          *(byte *)puVar4 = (byte)*puVar4 | 2;
          arena = MessageLite::GetArena((MessageLite *)this_00);
          protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)
                     &(this_00->field_0)._impl_.path_.soo_rep_.field_0.short_rep.field_1,
                     (string *)local_c0,arena);
          bVar2 = ParseMessageField(this,(FieldDescriptorProto *)extendee_location.location_,
                                    messages,parent_location,location_field_number_for_nested_type,
                                    (LocationRecorder *)&field,containing_file);
          if (!bVar2) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)&field);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_178,"}");
          bVar2 = TryConsumeEndOfDeclaration(this,local_178,(LocationRecorder *)0x0);
        } while (((bVar2 ^ 0xffU) & 1) != 0);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
LAB_00599ffb:
      extendee_end.end_column = 1;
      io::Tokenizer::Token::~Token((Token *)local_108);
    }
    else {
      this_local._7_1_ = false;
      extendee_end.end_column = 1;
    }
    std::__cxx11::string::~string((string *)local_c0);
    io::Tokenizer::Token::~Token((Token *)((long)&extendee.field_2 + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  std::string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type, location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}